

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O2

void __thiscall Network::update_triangles(Network *this,uint node_i,uint node_j,bool added)

{
  pointer puVar1;
  pointer psVar2;
  pointer puVar3;
  pointer psVar4;
  size_type sVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  pointer puVar8;
  uint uVar9;
  int iVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> intersection;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_40 = (ulong)node_i;
  psVar2 = (this->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = local_40 * 0x30;
  psVar4 = psVar2 + local_40;
  uVar7 = (ulong)node_j;
  iVar10 = 0;
  local_38 = uVar7;
  for (p_Var6 = *(_Base_ptr *)((long)&psVar2[local_40]._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var6 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    local_68._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68._M_impl.super__Vector_impl_data._M_start._4_4_,
                           p_Var6[1]._M_color);
    if (p_Var6[1]._M_color != node_j) {
      sVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((this->links).
                         super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar7,(key_type *)&local_68);
      iVar10 = (iVar10 + 1) - (uint)(sVar5 == 0);
    }
  }
  uVar9 = added - 1 | 1;
  puVar3 = (this->triangle_count).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + local_40;
  *puVar3 = *puVar3 + iVar10 * uVar9;
  this->total_triangles = this->total_triangles + iVar10 * uVar9;
  psVar2 = (this->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar10 = 0;
  for (p_Var6 = *(_Base_ptr *)((long)&psVar2[uVar7]._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var6 != &psVar2[uVar7]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    local_68._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68._M_impl.super__Vector_impl_data._M_start._4_4_,
                           p_Var6[1]._M_color);
    if (p_Var6[1]._M_color != node_i) {
      sVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)((long)&(((this->links).
                                      super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                    field_0x0 + local_48),(key_type *)&local_68);
      iVar10 = (iVar10 + 1) - (uint)(sVar5 == 0);
    }
  }
  puVar3 = (this->triangle_count).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + local_38;
  *puVar3 = *puVar3 + iVar10 * uVar9;
  this->total_triangles = this->total_triangles + iVar10 * uVar9;
  local_68._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = (this->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (*(undefined8 *)((long)&(psVar2->_M_t)._M_impl.super__Rb_tree_header + local_48 + 0x10U)
             ,(long)&(psVar2->_M_t)._M_impl.super__Rb_tree_header + local_48,
             *(_Base_ptr *)((long)&psVar2[uVar7]._M_t._M_impl.super__Rb_tree_header + 0x10));
  puVar3 = (this->triangle_count).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (puVar8 = local_68._M_impl.super__Vector_impl_data._M_start;
      puVar8 != local_68._M_impl.super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
    puVar1 = puVar3 + *puVar8;
    *puVar1 = *puVar1 + uVar9;
  }
  this->total_triangles =
       this->total_triangles +
       uVar9 * (int)((ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_68._M_impl.super__Vector_impl_data._M_start) >> 2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void update_triangles(unsigned int node_i, unsigned int node_j, bool added) {
        int sign = 2*added - 1;

        // update triangles in node_i
        unsigned int removed_triangles_i = 0;
        for (unsigned int node_k : links[node_i])
            if (node_k != node_j and links[node_j].count(node_k))
                removed_triangles_i++;
        triangle_count[node_i] += sign*removed_triangles_i;
        total_triangles += sign*removed_triangles_i;

        // update triangles in node_j
        unsigned int removed_triangles_j = 0;
        for (unsigned int node_k : links[node_j])
            if (node_k != node_i and links[node_i].count(node_k))
                removed_triangles_j++;
        triangle_count[node_j] += sign*removed_triangles_j;
        total_triangles += sign*removed_triangles_j;

        // update triangles in the other nodes.
        std::vector<unsigned int> intersection;
        std::set_intersection(links[node_i].begin(),
                              links[node_i].end(),
                              links[node_j].begin(),
                              links[node_j].end(),
                              std::back_inserter(intersection));

        for (unsigned int node_k : intersection)
            triangle_count[node_k] += sign*1;
        total_triangles += sign*intersection.size();
    }